

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void * multi_thread_kvs_client(void *args)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  fdb_kvs_handle *in_stack_fffffffffffff3c8;
  fdb_seqnum_t *in_stack_fffffffffffff3d0;
  fdb_kvs_handle *in_stack_fffffffffffff3d8;
  size_t in_stack_fffffffffffff3f0;
  void *apvStack_b98 [17];
  fdb_file_handle *in_stack_fffffffffffff508;
  void *in_stack_fffffffffffff510;
  fdb_doc **in_stack_fffffffffffff518;
  size_t in_stack_fffffffffffff530;
  fdb_kvs_config *in_stack_fffffffffffff570;
  char *in_stack_fffffffffffff578;
  fdb_kvs_handle **in_stack_fffffffffffff580;
  fdb_file_handle *in_stack_fffffffffffff588;
  undefined8 auStack_968 [3];
  fdb_kvs_config *in_stack_fffffffffffff6b0;
  char *in_stack_fffffffffffff6b8;
  fdb_kvs_handle **in_stack_fffffffffffff6c0;
  fdb_file_handle *in_stack_fffffffffffff6c8;
  fdb_config *in_stack_fffffffffffff728;
  char *in_stack_fffffffffffff730;
  fdb_file_handle **in_stack_fffffffffffff738;
  undefined1 local_800 [248];
  fdb_seqnum_t local_708;
  fdb_kvs_config local_700;
  fdb_kvs_config local_6e8 [11];
  undefined1 *local_5e0;
  void **thread_ret;
  pthread_t *tid;
  fdb_seqnum_t seqnum;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle **db;
  fdb_kvs_handle *tdb;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  char dbstr [256];
  int *tid_args;
  int nclients;
  int n;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  void *args_local;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  if (args == (void *)0x0) {
    memleak_start();
    system("rm -rf  dummy* > errorlog.txt");
    fdb_get_default_config();
    memcpy(&kvs_config.custom_cmp_param,&local_6e8[0].custom_cmp_param,0xf8);
    fVar1 = fdb_open(in_stack_fffffffffffff738,in_stack_fffffffffffff730,in_stack_fffffffffffff728);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x80a);
      multi_thread_kvs_client::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x80a,"void *multi_thread_kvs_client(void *)");
      }
    }
    thread_ret = apvStack_b98;
    local_5e0 = &stack0xfffffffffffff3c8;
    for (r = 0; r < 0x14; r = r + 1) {
      sprintf(keybuf + 0xf8,"db%d",(ulong)(uint)r);
      fdb_get_default_kvs_config();
      seqnum = (fdb_seqnum_t)local_700.custom_cmp_param;
      kvs_config.create_if_missing = local_6e8[0].create_if_missing;
      kvs_config._1_7_ = local_6e8[0]._1_7_;
      kvs_config.custom_cmp = local_6e8[0].custom_cmp;
      fVar1 = fdb_kvs_open(in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                           in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x812);
        multi_thread_kvs_client::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x812,"void *multi_thread_kvs_client(void *)");
        }
      }
      fVar1 = fdb_kvs_close(in_stack_fffffffffffff3c8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x814);
        multi_thread_kvs_client::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x814,"void *multi_thread_kvs_client(void *)");
        }
      }
    }
    for (r = 0; r < 0x14; r = r + 1) {
      *(int *)(&stack0xfffffffffffff738 + (long)r * 4) = r;
      pthread_create((pthread_t *)(thread_ret + r),(pthread_attr_t *)0x0,multi_thread_kvs_client,
                     &stack0xfffffffffffff738 + (long)r * 4);
    }
    for (r = 0; r < 0x14; r = r + 1) {
      pthread_join((pthread_t)thread_ret[r],(void **)(local_5e0 + (long)r * 8));
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff3c8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x820);
      multi_thread_kvs_client::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x820,"void *multi_thread_kvs_client(void *)");
      }
    }
    for (r = 0; r < 0x14; r = r + 1) {
      sprintf(keybuf + 0xf8,"db%d",(ulong)(uint)r);
      fdb_get_default_kvs_config();
      seqnum = local_708;
      kvs_config.create_if_missing = local_700.create_if_missing;
      kvs_config._1_7_ = local_700._1_7_;
      kvs_config.custom_cmp = local_700.custom_cmp;
      fVar1 = fdb_kvs_open(in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                           in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x827);
        multi_thread_kvs_client::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x827,"void *multi_thread_kvs_client(void *)");
        }
      }
      fVar1 = fdb_get_kvs_seqnum(in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x82b);
        multi_thread_kvs_client::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x82b,"void *multi_thread_kvs_client(void *)");
        }
      }
      if (tid != (pthread_t *)0x32) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x82c);
        multi_thread_kvs_client::__test_pass = 0;
        if (tid != (pthread_t *)0x32) {
          __assert_fail("seqnum == (fdb_seqnum_t)n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x82c,"void *multi_thread_kvs_client(void *)");
        }
      }
      for (n = 0; n < 0x32; n = n + 1) {
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
        sprintf((char *)&dbfile,"body%d",(ulong)(uint)n);
        pvVar4 = (void *)0x110580;
        strlen(metabuf + 0xf8);
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                       (size_t)in_stack_fffffffffffff3c8,pvVar4,0,(void *)0x1105ad,
                       in_stack_fffffffffffff3f0);
        fVar1 = fdb_get((fdb_kvs_handle *)auStack_968[r],(fdb_doc *)0x0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x835);
          multi_thread_kvs_client::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x835,"void *multi_thread_kvs_client(void *)");
          }
        }
        pvVar4 = pvRam0000000000000020;
        sVar3 = strlen(metabuf + 0xf8);
        iVar2 = memcmp(pvVar4,metabuf + 0xf8,sVar3);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x836);
          pvVar4 = pvRam0000000000000020;
          multi_thread_kvs_client::__test_pass = 0;
          sVar3 = strlen(metabuf + 0xf8);
          iVar2 = memcmp(pvVar4,metabuf + 0xf8,sVar3);
          if (iVar2 != 0) {
            __assert_fail("!memcmp(rdoc->key, keybuf, strlen(keybuf))",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x836,"void *multi_thread_kvs_client(void *)");
          }
        }
        iVar2 = memcmp(pvRam0000000000000038,bodybuf + 0xf8,sRam0000000000000008);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x837);
          multi_thread_kvs_client::__test_pass = 0;
          iVar2 = memcmp(pvRam0000000000000038,bodybuf + 0xf8,sRam0000000000000008);
          if (iVar2 != 0) {
            __assert_fail("!memcmp(rdoc->meta, metabuf, rdoc->metalen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x837,"void *multi_thread_kvs_client(void *)");
          }
        }
        iVar2 = memcmp(pvRam0000000000000040,&dbfile,sRam0000000000000010);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x838);
          multi_thread_kvs_client::__test_pass = 0;
          iVar2 = memcmp(pvRam0000000000000040,&dbfile,sRam0000000000000010);
          if (iVar2 != 0) {
            __assert_fail("!memcmp(rdoc->body, bodybuf, rdoc->bodylen)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x838,"void *multi_thread_kvs_client(void *)");
          }
        }
        fdb_doc_free((fdb_doc *)0x110885);
      }
      fVar1 = fdb_kvs_close(in_stack_fffffffffffff3c8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x83c);
        multi_thread_kvs_client::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x83c,"void *multi_thread_kvs_client(void *)");
        }
      }
    }
    fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffff3c8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x840);
      multi_thread_kvs_client::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x840,"void *multi_thread_kvs_client(void *)");
      }
    }
    fdb_shutdown();
    memleak_end();
    if (multi_thread_kvs_client::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n","multi thread kvs client");
    }
    else {
      fprintf(_stderr,"%s PASSED\n","multi thread kvs client");
    }
  }
  else {
    fdb_get_default_config();
    memcpy(&kvs_config.custom_cmp_param,local_800,0xf8);
    fVar1 = fdb_open(in_stack_fffffffffffff738,in_stack_fffffffffffff730,in_stack_fffffffffffff728);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x84c);
      multi_thread_kvs_client::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x84c,"void *multi_thread_kvs_client(void *)");
      }
    }
    sprintf(keybuf + 0xf8,"db%d",(ulong)*args);
    fdb_get_default_kvs_config();
    fVar1 = fdb_kvs_open(in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                         in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x853);
      multi_thread_kvs_client::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x853,"void *multi_thread_kvs_client(void *)");
      }
    }
    for (r = 0; r < 0x32; r = r + 1) {
      sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)r);
      sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)r);
      sprintf((char *)&dbfile,"body%d",(ulong)(uint)r);
      strlen(metabuf + 0xf8);
      strlen(bodybuf + 0xf8);
      pvVar4 = (void *)0x110c4d;
      sVar3 = strlen((char *)&dbfile);
      fdb_doc_create(in_stack_fffffffffffff518,in_stack_fffffffffffff510,
                     (size_t)in_stack_fffffffffffff508,pvVar4,sVar3,(void *)0x110c84,
                     in_stack_fffffffffffff530);
      fVar1 = fdb_set((fdb_kvs_handle *)db,*(fdb_doc **)(&stack0xfffffffffffff508 + (long)r * 8));
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x85e);
        multi_thread_kvs_client::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x85e,"void *multi_thread_kvs_client(void *)");
        }
      }
      fdb_doc_free((fdb_doc *)0x110d20);
    }
    fVar1 = fdb_commit(in_stack_fffffffffffff508,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x862);
      multi_thread_kvs_client::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x862,"void *multi_thread_kvs_client(void *)");
      }
    }
    fdb_close(in_stack_fffffffffffff508);
  }
  return (void *)0x0;
}

Assistant:

void *multi_thread_kvs_client(void *args)
{

    TEST_INIT();

    int i, j, r;
    int n = 50;
    int nclients = 20;
    int *tid_args = alca(int, nclients);
    char dbstr[256];
    char keybuf[256], metabuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *tdb;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, nclients);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_seqnum_t seqnum;
    thread_t *tid;
    void **thread_ret;

    if (args == NULL)
    { // parent
        memleak_start();

        r = system(SHELL_DEL" dummy* > errorlog.txt");
        (void)r;

        // init dbfile
        fconfig = fdb_get_default_config();
        fconfig.buffercache_size = 0;
        fconfig.wal_threshold = 1024;
        fconfig.compaction_threshold = 0;

        status = fdb_open(&dbfile, "./dummy1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        tid = alca(thread_t, nclients);
        thread_ret = alca(void *, nclients);
        for (i=0;i<nclients;++i){
            sprintf(dbstr, "db%d", i);
            kvs_config = fdb_get_default_kvs_config();
            status = fdb_kvs_open(dbfile, &db[i], dbstr, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_kvs_close(db[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        for (i=0;i<nclients;++i){
            tid_args[i] = i;
            thread_create(&tid[i], multi_thread_kvs_client,
                          (void *)&tid_args[i]);
        }
        for (i=0;i<nclients;++i){
            thread_join(tid[i], &thread_ret[i]);
        }

        status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // check threads updated kvs
        for (i=0; i<nclients; i++){
            sprintf(dbstr, "db%d", i);
            kvs_config = fdb_get_default_kvs_config();
            status = fdb_kvs_open(dbfile, &db[i], dbstr, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);

            // verify seqnum
            status = fdb_get_kvs_seqnum(db[i], &seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(seqnum == (fdb_seqnum_t)n);

            for (j=0; j<n; j++){
                sprintf(keybuf, "key%d", j);
                sprintf(metabuf, "meta%d", j);
                sprintf(bodybuf, "body%d", j);
                fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                                      NULL, 0, NULL, 0);
                status = fdb_get(db[i], rdoc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);
                TEST_CHK(!memcmp(rdoc->key, keybuf, strlen(keybuf)));
                TEST_CHK(!memcmp(rdoc->meta, metabuf, rdoc->metalen));
                TEST_CHK(!memcmp(rdoc->body, bodybuf, rdoc->bodylen));
                fdb_doc_free(rdoc);
            }
            status = fdb_kvs_close(db[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_shutdown();
        memleak_end();
        TEST_RESULT("multi thread kvs client");
        return NULL;
    }

    // threads enter here //

    // open fhandle
    fconfig = fdb_get_default_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get kvs ID from args
    memcpy(&i, args, sizeof(int));
    sprintf(dbstr, "db%d", i);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open(dbfile, &tdb, dbstr, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(tdb, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    return NULL;
}